

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

iter_type __thiscall
booster::locale::impl_icu::num_parse<wchar_t>::do_real_get<unsigned_long_long>
          (num_parse<wchar_t> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          unsigned_long_long *val)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int_type iVar3;
  long *plVar4;
  ulong uVar5;
  streambuf_type *psVar6;
  streambuf_type *psVar7;
  int_type iVar8;
  ulong uVar9;
  istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> iVar10;
  iter_type iVar11;
  iter_type iVar12;
  iter_type __end;
  istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> local_88;
  iter_type end_local;
  cast_type value;
  int_type local_58;
  string_type tmp;
  
  psVar7 = end._M_sbuf;
  psVar6 = in._M_sbuf;
  iVar8 = end._M_c;
  iVar3 = in._M_c;
  local_88._M_sbuf = psVar6;
  local_88._M_c = iVar3;
  end_local._M_sbuf = psVar7;
  end_local._M_c = iVar8;
  plVar4 = (long *)__dynamic_cast(ios,&std::ios_base::typeinfo,&std::wistream::typeinfo,
                                  0xffffffffffffffff);
  if (((plVar4 == (long *)0x0) || (bVar2 = num_base::use_parent<unsigned_long_long>(ios,0), bVar2))
     || (formatter<wchar_t>::create((formatter<wchar_t> *)&tmp,ios,&this->loc_,&this->enc_),
        _Var1 = tmp._M_dataplus, psVar6 = local_88._M_sbuf, psVar7 = end_local._M_sbuf,
        iVar3 = local_88._M_c, iVar8 = end_local._M_c, tmp._M_dataplus._M_p == (pointer)0x0)) {
    iVar11._M_c = iVar3;
    iVar11._M_sbuf = psVar6;
    iVar11._12_4_ = 0;
    __end._M_c = iVar8;
    __end._M_sbuf = psVar7;
    __end._12_4_ = 0;
    iVar11 = std::num_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::
             _M_extract_int_abi_cxx11_<unsigned_long_long>
                       ((num_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>
                         *)this,iVar11,__end,ios,err,val);
    psVar6 = iVar11._M_sbuf;
    iVar3 = iVar11._M_c;
  }
  else {
    tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
    tmp._M_string_length = 0;
    tmp.field_2._M_local_buf[0] = L'\0';
    std::__cxx11::wstring::reserve((ulong)&tmp);
    while ((bVar2 = std::operator!=(&local_88,&end_local), bVar2 &&
           (iVar3 = std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::_M_get(&local_88)
           , iVar3 == 0x7f || iVar3 - 1 < 0x20))) {
      std::wstreambuf::sbumpc();
      local_88._M_c = 0xffffffff;
    }
    while (((tmp._M_string_length < 0x1000 && (bVar2 = std::operator!=(&local_88,&end_local), bVar2)
            ) && (iVar3 = std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::_M_get
                                    (&local_88), iVar3 != 10))) {
      iVar10 = std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::operator++
                         (&local_88,0);
      value = (cast_type)iVar10._M_sbuf;
      local_58 = iVar10._M_c;
      std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::_M_get
                ((istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_> *)&value);
      std::__cxx11::wstring::push_back((wchar_t)&tmp);
    }
    uVar5 = (**(code **)(*(long *)_Var1._M_p + 0x30))(_Var1._M_p,&tmp,&value);
    uVar9 = tmp._M_string_length;
    if ((uVar5 == 0) || (value < 0)) {
      *(undefined1 *)err = (char)*err | _S_failbit;
    }
    else {
      *val = value;
    }
    for (; uVar5 < uVar9; uVar9 = uVar9 - 1) {
      std::wistream::putback((wchar_t)plVar4);
    }
    local_88._M_sbuf = *(streambuf_type **)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0xe8);
    local_88._M_c = 0xffffffff;
    bVar2 = std::istreambuf_iterator<wchar_t,_std::char_traits<wchar_t>_>::equal
                      (&local_88,&end_local);
    iVar3 = local_88._M_c;
    psVar6 = local_88._M_sbuf;
    if (bVar2) {
      *(undefined1 *)err = (char)*err | _S_eofbit;
    }
    std::__cxx11::wstring::~wstring((wstring *)&tmp);
    (**(code **)(*(long *)_Var1._M_p + 8))(_Var1._M_p);
  }
  iVar12._M_c = iVar3;
  iVar12._M_sbuf = psVar6;
  iVar12._12_4_ = 0;
  return iVar12;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        formatter_ptr formatter;
        stream_type *stream_ptr = dynamic_cast<stream_type *>(&ios);

        if(!stream_ptr || use_parent<ValueType>(ios,0) || (formatter = formatter_type::create(ios,loc_,enc_)).get()==0) {
            return std::num_get<CharType>::do_get(in,end,ios,err,val);
        }

        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type tmp;
        tmp.reserve(64);

        CharType c;
        while(in!=end && (((c=*in)<=32 && (c>0)) || c==127)) // Assuming that ASCII is a subset
            ++in;

        while(tmp.size() < 4096 && in!=end && *in!='\n') {
            tmp += *in++;
        }

        cast_type value;
        size_t parsed_chars;

        if((parsed_chars = formatter->parse(tmp,value))==0 || !valid<ValueType>(value)) {
            err |= std::ios_base::failbit;
        }
        else {
            val=static_cast<ValueType>(value);
        }

        for(size_t n=tmp.size();n>parsed_chars;n--) {
            stream_ptr->putback(tmp[n-1]);
        }

        in = iter_type(*stream_ptr);

        if(in==end)
            err |=std::ios_base::eofbit;
        return in;
    }